

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZMCTargetDesc.c
# Opt level: O2

uint SystemZMC_getFirstReg(uint Reg)

{
  long lVar1;
  uint uVar2;
  
  if (SystemZMC_getFirstReg_Initialized == '\0') {
    SystemZMC_getFirstReg_Initialized = '\x01';
    uVar2 = 0;
    for (lVar1 = -0x40; lVar1 != 0; lVar1 = lVar1 + 4) {
      SystemZMC_getFirstReg::Map[*(uint *)((long)SystemZMC_GRH32Regs + lVar1)] = uVar2;
      SystemZMC_getFirstReg::Map[*(uint *)((long)SystemZMC_GR64Regs + lVar1)] = uVar2;
      SystemZMC_getFirstReg::Map[*(uint *)((long)SystemZMC_GR128Regs + lVar1)] = uVar2;
      SystemZMC_getFirstReg::Map[*(uint *)((long)SystemZMC_FP32Regs + lVar1)] = uVar2;
      SystemZMC_getFirstReg::Map[*(uint *)((long)SystemZMC_FP64Regs + lVar1)] = uVar2;
      SystemZMC_getFirstReg::Map[*(uint *)((long)SystemZMC_FP128Regs + lVar1)] = uVar2;
      SystemZMC_getFirstReg::Map[*(uint *)((long)SystemZMC_VR32Regs + lVar1)] = uVar2;
      SystemZMC_getFirstReg::Map[*(uint *)((long)SystemZMC_VR32Regs + lVar1 + 0x40)] = uVar2;
      SystemZMC_getFirstReg::Map[*(uint *)((long)SystemZMC_VR64Regs + lVar1 + 0x40)] = uVar2;
      SystemZMC_getFirstReg::Map[*(uint *)((long)SystemZMC_VR128Regs + lVar1 + 0x40)] = uVar2;
      SystemZMC_getFirstReg::Map[*(uint *)((long)SystemZMC_CR64Regs + lVar1)] = uVar2;
      SystemZMC_getFirstReg::Map[*(uint *)((long)&switchD_002352ef::switchdataD_00514eb0 + lVar1)] =
           uVar2;
      uVar2 = uVar2 + 1;
    }
  }
  return SystemZMC_getFirstReg::Map[Reg];
}

Assistant:

unsigned SystemZMC_getFirstReg(unsigned Reg)
{
	static unsigned Map[SystemZ_NUM_TARGET_REGS];
	static int Initialized = 0;
	unsigned I;

	if (!Initialized) {
		Initialized = 1;
		for (I = 0; I < 16; ++I) {
			Map[SystemZMC_GR32Regs[I]] = I;
			Map[SystemZMC_GRH32Regs[I]] = I;
			Map[SystemZMC_GR64Regs[I]] = I;
			Map[SystemZMC_GR128Regs[I]] = I;
			Map[SystemZMC_FP32Regs[I]] = I;
			Map[SystemZMC_FP64Regs[I]] = I;
			Map[SystemZMC_FP128Regs[I]] = I;
			Map[SystemZMC_VR32Regs[I]] = I;
			Map[SystemZMC_VR64Regs[I]] = I;
			Map[SystemZMC_VR128Regs[I]] = I;
			Map[SystemZMC_AR32Regs[I]] = I;
			Map[SystemZMC_CR64Regs[I]] = I;
		}
	}

	// assert(Reg < SystemZ_NUM_TARGET_REGS);
	return Map[Reg];
}